

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O1

void __thiscall deqp::gls::FboUtil::addFormats(FboUtil *this,FormatDB *db,FormatEntries stdFmts)

{
  mapped_type mVar1;
  mapped_type *pmVar2;
  FormatEntry *it;
  _Base_ptr p_Var3;
  key_type local_38;
  
  if (db != (FormatDB *)stdFmts.m_begin) {
    do {
      for (p_Var3 = *(_Base_ptr *)&(db->m_formatFlags)._M_t._M_impl.super__Rb_tree_header._M_header;
          p_Var3 != (db->m_formatFlags)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var3 = (_Base_ptr)&p_Var3->field_0x4) {
        local_38 = (key_type)
                   (CONCAT44(p_Var3->_M_color >> 0x10,p_Var3->_M_color) & 0xffffffff0000ffff);
        mVar1 = *(mapped_type *)&(db->m_formatFlags)._M_t._M_impl;
        pmVar2 = std::
                 map<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::FormatFlags,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<std::pair<const_deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::FormatFlags>_>_>
                 ::operator[]((map<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::FormatFlags,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<std::pair<const_deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::FormatFlags>_>_>
                               *)this,&local_38);
        *pmVar2 = *pmVar2 | mVar1;
      }
      db = (FormatDB *)&(db->m_formatFlags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    } while (db != (FormatDB *)stdFmts.m_begin);
  }
  return;
}

Assistant:

void addFormats (FormatDB& db, FormatEntries stdFmts)
{
	for (const FormatEntry* it = stdFmts.begin(); it != stdFmts.end(); it++)
	{
		for (const FormatKey* it2 = it->second.begin(); it2 != it->second.end(); it2++)
			db.addCoreFormat(formatKeyInfo(*it2), it->first);
	}
}